

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O3

void memXor2(void *dest,void *src,size_t count)

{
  size_t sVar1;
  
  if (7 < count) {
    do {
      *(ulong *)dest = *dest ^ *src;
      src = (void *)((long)src + 8);
      dest = (void *)((long)dest + 8);
      count = count - 8;
    } while (7 < count);
  }
  if (count != 0) {
    sVar1 = 0;
    do {
      *(byte *)((long)dest + sVar1) = *(byte *)((long)dest + sVar1) ^ *(byte *)((long)src + sVar1);
      sVar1 = sVar1 + 1;
    } while (count != sVar1);
  }
  return;
}

Assistant:

void memXor2(void* dest, const void* src, size_t count)
{
	ASSERT(memIsSameOrDisjoint(src, dest, count));
	for (; count >= O_PER_W; count -= O_PER_W)
	{
		*(word*)dest ^= *(const word*)src;
		src = (const word*)src + 1;
		dest = (word*)dest + 1;
	}
	while (count--)
	{
		*(octet*)dest ^= *(const octet*)src;
		src = (const octet*)src + 1;
		dest = (octet*)dest + 1;
	}
}